

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  u8 uVar1;
  Fts3Expr *pFVar2;
  Fts3Expr *pFVar3;
  Fts3Phrase *pFVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  bool local_8d;
  bool local_8a;
  Fts3Phrase *pPhrase;
  Fts3Expr *pRight_2;
  Fts3Expr *pLeft_2;
  sqlite3_int64 iCmp;
  Fts3Expr *pRight_1;
  Fts3Expr *pLeft_1;
  Fts3Doclist *pDl_1;
  Fts3Doclist *pDl;
  sqlite3_int64 iDiff;
  Fts3Expr *pRight;
  Fts3Expr *pLeft;
  int bDescDoclist;
  int *pRc_local;
  Fts3Expr *pExpr_local;
  Fts3Cursor *pCsr_local;
  
  if (*pRc == 0) {
    uVar1 = pCsr->bDesc;
    pExpr->bStart = '\x01';
    switch(pExpr->eType) {
    case 1:
    case 3:
      pFVar2 = pExpr->pLeft;
      pFVar3 = pExpr->pRight;
      if (pFVar2->bDeferred == '\0') {
        if (pFVar3->bDeferred == '\0') {
          fts3EvalNextRow(pCsr,pFVar2,pRc);
          fts3EvalNextRow(pCsr,pFVar3,pRc);
          while( true ) {
            bVar7 = false;
            if ((pFVar2->bEof == '\0') && (bVar7 = false, pFVar3->bEof == '\0')) {
              bVar7 = *pRc == 0;
            }
            if (!bVar7) break;
            iVar5 = 1;
            if (uVar1 != '\0') {
              iVar5 = -1;
            }
            lVar6 = (long)iVar5 * (pFVar2->iDocid - pFVar3->iDocid);
            if (lVar6 == 0) break;
            if (lVar6 < 0) {
              fts3EvalNextRow(pCsr,pFVar2,pRc);
            }
            else {
              fts3EvalNextRow(pCsr,pFVar3,pRc);
            }
          }
          pExpr->iDocid = pFVar2->iDocid;
          local_8a = true;
          if (pFVar2->bEof == '\0') {
            local_8a = pFVar3->bEof != '\0';
          }
          pExpr->bEof = local_8a;
          if ((pExpr->eType == 1) && (pExpr->bEof != '\0')) {
            if ((pFVar3->pPhrase->doclist).aAll != (char *)0x0) {
              pFVar4 = pFVar3->pPhrase;
              while( true ) {
                bVar7 = false;
                if (*pRc == 0) {
                  bVar7 = pFVar3->bEof == '\0';
                }
                if (!bVar7) break;
                memset((pFVar4->doclist).pList,0,(long)(pFVar4->doclist).nList);
                fts3EvalNextRow(pCsr,pFVar3,pRc);
              }
            }
            if ((pFVar2->pPhrase != (Fts3Phrase *)0x0) &&
               ((pFVar2->pPhrase->doclist).aAll != (char *)0x0)) {
              pFVar4 = pFVar2->pPhrase;
              while( true ) {
                bVar7 = false;
                if (*pRc == 0) {
                  bVar7 = pFVar2->bEof == '\0';
                }
                if (!bVar7) break;
                memset((pFVar4->doclist).pList,0,(long)(pFVar4->doclist).nList);
                fts3EvalNextRow(pCsr,pFVar2,pRc);
              }
            }
          }
        }
        else {
          fts3EvalNextRow(pCsr,pFVar2,pRc);
          pExpr->iDocid = pFVar2->iDocid;
          pExpr->bEof = pFVar2->bEof;
        }
      }
      else {
        fts3EvalNextRow(pCsr,pFVar3,pRc);
        pExpr->iDocid = pFVar3->iDocid;
        pExpr->bEof = pFVar3->bEof;
      }
      break;
    case 2:
      pFVar2 = pExpr->pLeft;
      pFVar3 = pExpr->pRight;
      if (pFVar3->bStart == '\0') {
        fts3EvalNextRow(pCsr,pFVar3,pRc);
      }
      fts3EvalNextRow(pCsr,pFVar2,pRc);
      if (pFVar2->bEof == '\0') {
        while( true ) {
          bVar7 = false;
          if ((*pRc == 0) && (bVar7 = false, pFVar3->bEof == '\0')) {
            iVar5 = 1;
            if (uVar1 != '\0') {
              iVar5 = -1;
            }
            bVar7 = 0 < (long)iVar5 * (pFVar2->iDocid - pFVar3->iDocid);
          }
          if (!bVar7) break;
          fts3EvalNextRow(pCsr,pFVar3,pRc);
        }
      }
      pExpr->iDocid = pFVar2->iDocid;
      pExpr->bEof = pFVar2->bEof;
      break;
    case 4:
      pFVar2 = pExpr->pLeft;
      pFVar3 = pExpr->pRight;
      iVar5 = 1;
      if (uVar1 != '\0') {
        iVar5 = -1;
      }
      lVar6 = (long)iVar5 * (pFVar2->iDocid - pFVar3->iDocid);
      if ((pFVar3->bEof == '\0') && ((pFVar2->bEof != '\0' || (-1 < lVar6)))) {
        if ((pFVar2->bEof == '\0') && (lVar6 < 1)) {
          fts3EvalNextRow(pCsr,pFVar2,pRc);
          fts3EvalNextRow(pCsr,pFVar3,pRc);
        }
        else {
          fts3EvalNextRow(pCsr,pFVar3,pRc);
        }
      }
      else {
        fts3EvalNextRow(pCsr,pFVar2,pRc);
      }
      local_8d = false;
      if (pFVar2->bEof != '\0') {
        local_8d = pFVar3->bEof != '\0';
      }
      pExpr->bEof = local_8d;
      iVar5 = 1;
      if (uVar1 != '\0') {
        iVar5 = -1;
      }
      if ((pFVar3->bEof == '\0') &&
         ((pFVar2->bEof != '\0' || (-1 < (long)iVar5 * (pFVar2->iDocid - pFVar3->iDocid))))) {
        pExpr->iDocid = pFVar3->iDocid;
      }
      else {
        pExpr->iDocid = pFVar2->iDocid;
      }
      break;
    default:
      pFVar4 = pExpr->pPhrase;
      fts3EvalInvalidatePoslist(pFVar4);
      iVar5 = fts3EvalPhraseNext(pCsr,pFVar4,&pExpr->bEof);
      *pRc = iVar5;
      pExpr->iDocid = (pFVar4->doclist).iDocid;
    }
  }
  return;
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    assert( pExpr->bEof==0 );
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            assert( pRight->eType==FTSQUERY_PHRASE );
            if( pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
          }
        }
        break;
      }
  
      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || iCmp>0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc 
              && !pRight->bEof 
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0 
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}